

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall VertexBuffer::~VertexBuffer(VertexBuffer *this)

{
  VertexBuffer *this_local;
  
  (*glad_glDeleteBuffers)(1,&this->m_id);
  BufferLayout::~BufferLayout(&this->m_layout);
  return;
}

Assistant:

VertexBuffer::~VertexBuffer()
{
    glDeleteBuffers(1, &m_id);
}